

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TDefaultIoResolverBase::checkEmpty(TDefaultIoResolverBase *this,int set,int slot)

{
  bool bVar1;
  mapped_type *this_00;
  reference piVar2;
  bool local_29;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  iterator at;
  int slot_local;
  int set_local;
  TDefaultIoResolverBase *this_local;
  
  at._M_current._0_4_ = slot;
  at._M_current._4_4_ = set;
  local_20._M_current = (int *)findSlot(this,set,slot);
  this_00 = std::
            unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->slots,(key_type *)((long)&at._M_current + 4));
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(this_00);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
  local_29 = false;
  if (bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    local_29 = *piVar2 == (int)at._M_current;
  }
  return (bool)((local_29 ^ 0xffU) & 1);
}

Assistant:

bool TDefaultIoResolverBase::checkEmpty(int set, int slot) {
    TSlotSet::iterator at = findSlot(set, slot);
    return ! (at != slots[set].end() && *at == slot);
}